

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void __thiscall chaiscript::Boxed_Number::Boxed_Number(Boxed_Number *this,Boxed_Value *v)

{
  Boxed_Value *in_RSI;
  Boxed_Value *in_RDI;
  Boxed_Value *in_stack_ffffffffffffffe0;
  
  Boxed_Value::Boxed_Value(in_stack_ffffffffffffffe0,in_RDI);
  validate_boxed_number(in_RSI);
  return;
}

Assistant:

Boxed_Number(Boxed_Value v)
        : bv(std::move(v))
      {
        validate_boxed_number(bv);
      }